

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::DeepTiledOutputFile::writeTiles
          (DeepTiledOutputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  size_t *psVar1;
  TileMap *this_00;
  _Rb_tree_header *p_Var2;
  pthread_mutex_t *__mutex;
  Data *pDVar3;
  pointer ppTVar4;
  TileBuffer *pTVar5;
  char *pixelData;
  Compressor *pixelDataSize;
  Int64 unpackedDataSize;
  char *sampleCountTableData;
  Int64 sampleCountTableSize;
  BufferedTile *this_01;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  TileBufferTask *pTVar12;
  Int64 *pIVar13;
  iterator iVar14;
  iterator iVar15;
  _Base_ptr p_Var16;
  _Rb_tree_node_base *p_Var17;
  _Rb_tree_node_base *p_Var18;
  ostream *poVar19;
  ArgExc *pAVar20;
  IoExc *this_02;
  int iVar21;
  int iVar22;
  int iVar23;
  _Base_ptr p_Var24;
  uint uVar25;
  long lVar26;
  _Base_ptr p_Var27;
  TileCoord *__y;
  TileCoord *extraout_RDX;
  TileCoord *__y_00;
  TileCoord *extraout_RDX_00;
  TileCoord *extraout_RDX_01;
  TileCoord *extraout_RDX_02;
  TileCoord *pTVar28;
  TileCoord *extraout_RDX_03;
  TileCoord *extraout_RDX_04;
  ulong uVar29;
  string *psVar30;
  string *text;
  _Base_ptr p_Var31;
  void *pvVar32;
  _Rb_tree_node_base *__x;
  int iVar33;
  ulong __n;
  _Rb_tree_node_base *p_Var34;
  TileCoord TVar35;
  undefined1 auVar36 [16];
  int local_3c4;
  char *local_3c0;
  ulong local_3a0;
  TileCoord currentTile;
  stringstream _iex_throw_s;
  ostream local_330 [376];
  TaskGroup taskGroup;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar7 = pthread_mutex_lock(__mutex);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  pDVar3 = this->_data;
  if ((pDVar3->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pDVar3->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_3c0 = "No frame buffer specified as pixel data source.";
  }
  else {
    bVar6 = isValidTile(this,dx1,dy1,lx,ly);
    local_3c0 = "Tile coordinates are invalid.";
    if ((bVar6) && (bVar6 = isValidTile(this,dx2,dy2,lx,ly), bVar6)) {
      if (((ly | lx) < 0) ||
         ((((lx != ly && ((pDVar3->tileDesc).mode == MIPMAP_LEVELS)) || (pDVar3->numXLevels <= lx))
          || (pDVar3->numYLevels <= ly)))) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        std::__ostream_insert<char,std::char_traits<char>>(local_330,"Level coordinate (",0x12);
        poVar19 = (ostream *)std::ostream::operator<<((ostream *)local_330,lx);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
        poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,ly);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,") is invalid.",0xd);
        pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar20,&_iex_throw_s);
        __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
      }
      iVar7 = dx2;
      if (dx2 < dx1) {
        iVar7 = dx1;
      }
      lVar10 = (long)dx2;
      if (dx1 < dx2) {
        dx2 = dx1;
      }
      iVar21 = dy2;
      if (dy2 < dy1) {
        iVar21 = dy1;
      }
      lVar26 = (long)dy2;
      if (dy1 < dy2) {
        dy2 = dy1;
      }
      bVar6 = pDVar3->lineOrder != DECREASING_Y;
      if (!bVar6) {
        dy2 = iVar21;
      }
      lVar10 = dx1 - lVar10;
      lVar11 = -lVar10;
      if (0 < lVar10) {
        lVar11 = lVar10;
      }
      lVar26 = dy1 - lVar26;
      lVar10 = -lVar26;
      if (0 < lVar26) {
        lVar10 = lVar26;
      }
      uVar25 = ((int)lVar10 + 1) * ((int)lVar11 + 1);
      uVar29 = (ulong)((long)(pDVar3->tileBuffers).
                             super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pDVar3->tileBuffers).
                            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3;
      local_3a0 = uVar29 & 0xffffffff;
      if ((int)uVar25 < (int)uVar29) {
        local_3a0 = (ulong)uVar25;
      }
      IlmThread_2_5::TaskGroup::TaskGroup(&taskGroup);
      iVar8 = (uint)bVar6 * 2 + -1;
      local_3c4 = dy2;
      iVar21 = dx2;
      if ((int)local_3a0 < 1) {
        local_3a0 = 0;
      }
      else {
        iVar33 = 0;
        do {
          pTVar12 = (TileBufferTask *)operator_new(0x20);
          anon_unknown_8::TileBufferTask::TileBufferTask
                    (pTVar12,&taskGroup,this->_data,iVar33,iVar21,local_3c4,lx,ly);
          IlmThread_2_5::ThreadPool::addGlobalTask((Task *)pTVar12);
          iVar33 = iVar33 + 1;
          iVar9 = iVar21 + 1;
          bVar6 = iVar21 < iVar7;
          iVar23 = iVar8;
          iVar21 = dx2;
          if (bVar6) {
            iVar23 = 0;
            iVar21 = iVar9;
          }
          local_3c4 = local_3c4 + iVar23;
        } while ((int)local_3a0 != iVar33);
      }
      if (0 < (int)uVar25) {
        uVar29 = 0;
        iVar33 = dx2;
        do {
          ppTVar4 = (this->_data->tileBuffers).
                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pvVar32 = (void *)((long)(this->_data->tileBuffers).
                                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4 >> 3);
          pTVar5 = ppTVar4[uVar29 % (ulong)pvVar32];
          IlmThread_2_5::Semaphore::wait((Semaphore *)&pTVar5[1].dataSize,pvVar32);
          pDVar3 = this->_data;
          pixelData = *(char **)&pTVar5->dataSize;
          pixelDataSize = pTVar5->compressor;
          unpackedDataSize._0_4_ = pTVar5->format;
          unpackedDataSize._4_4_ = pTVar5->dx;
          sampleCountTableData = (char *)(pTVar5->exception)._M_string_length;
          sampleCountTableSize = (pTVar5->exception).field_2._M_allocated_capacity;
          pIVar13 = TileOffsets::operator()(&pDVar3->tileOffsets,iVar33,dy2,lx,ly);
          if (*pIVar13 != 0) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_330,"Attempt to write tile (",0x17);
            poVar19 = (ostream *)std::ostream::operator<<((ostream *)local_330,iVar33);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
            poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,dy2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
            poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,lx);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
            poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,ly);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,") more than once.",0x11);
            pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(pAVar20,&_iex_throw_s);
            __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
          }
          if (pDVar3->lineOrder == RANDOM_Y) {
            anon_unknown_8::writeTileData
                      (pDVar3,iVar33,dy2,lx,ly,pixelData,(Int64)pixelDataSize,unpackedDataSize,
                       sampleCountTableData,sampleCountTableSize);
          }
          else {
            currentTile.ly = ly;
            this_00 = &pDVar3->tileMap;
            currentTile.dx = iVar33;
            currentTile.dy = dy2;
            currentTile.lx = lx;
            iVar14 = std::
                     map<Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_2_5::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>_>
                     ::find(this_00,&currentTile);
            p_Var2 = &(pDVar3->tileMap)._M_t._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)iVar14._M_node != p_Var2) {
              iex_debugTrap();
              std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_330,"Attempt to write tile (",0x17);
              poVar19 = (ostream *)std::ostream::operator<<((ostream *)local_330,iVar33);
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
              poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,dy2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
              poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,lx);
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
              poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,ly);
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,") more than once.",0x11);
              pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_2_5::ArgExc::ArgExc(pAVar20,&_iex_throw_s);
              __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
            }
            if ((((pDVar3->nextTileToWrite).lx == lx) && ((pDVar3->nextTileToWrite).ly == ly)) &&
               ((pTVar28 = &pDVar3->nextTileToWrite, pTVar28->dx == iVar33 &&
                ((pDVar3->nextTileToWrite).dy == dy2)))) {
              anon_unknown_8::writeTileData
                        (pDVar3,iVar33,dy2,lx,ly,pixelData,(Int64)pixelDataSize,unpackedDataSize,
                         sampleCountTableData,sampleCountTableSize);
              TVar35 = Data::nextTileCoord(pDVar3,*(TileCoord **)&pDVar3->nextTileToWrite);
              pDVar3->nextTileToWrite = TVar35;
              iVar15 = std::
                       map<Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_2_5::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>_>
                       ::find(this_00,pTVar28);
              while (iVar15._M_node != iVar14._M_node) {
                p_Var31 = iVar15._M_node[1]._M_left;
                anon_unknown_8::writeTileData
                          (pDVar3,iVar15._M_node[1]._M_color,*(int *)&iVar15._M_node[1].field_0x4,
                           *(int *)&iVar15._M_node[1]._M_parent,
                           *(int *)((long)&iVar15._M_node[1]._M_parent + 4),*(char **)p_Var31,
                           (Int64)p_Var31->_M_parent,(Int64)p_Var31->_M_left,
                           (char *)p_Var31->_M_right,*(Int64 *)(p_Var31 + 1));
                this_01 = (BufferedTile *)iVar15._M_node[1]._M_left;
                if (this_01 != (BufferedTile *)0x0) {
                  anon_unknown_8::BufferedTile::~BufferedTile(this_01);
                }
                operator_delete(this_01,0x28);
                pvVar32 = (void *)std::_Rb_tree_rebalance_for_erase
                                            (iVar15._M_node,&p_Var2->_M_header);
                operator_delete(pvVar32,0x38);
                psVar1 = &(pDVar3->tileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
                *psVar1 = *psVar1 - 1;
                TVar35 = Data::nextTileCoord(pDVar3,*(TileCoord **)&pDVar3->nextTileToWrite);
                pDVar3->nextTileToWrite = TVar35;
                iVar15 = std::
                         map<Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_2_5::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>_>
                         ::find(this_00,pTVar28);
              }
            }
            else {
              p_Var16 = (_Base_ptr)operator_new(0x28);
              *(undefined8 *)p_Var16 = 0;
              p_Var31 = (_Base_ptr)(long)(int)pixelDataSize;
              p_Var16->_M_parent = p_Var31;
              p_Var16->_M_left = (_Base_ptr)(long)(int)(undefined4)unpackedDataSize;
              p_Var16->_M_right = (_Base_ptr)0x0;
              __n = (ulong)(int)sampleCountTableSize;
              *(ulong *)(p_Var16 + 1) = __n;
              pvVar32 = operator_new__((ulong)p_Var31);
              *(void **)p_Var16 = pvVar32;
              memcpy(pvVar32,pixelData,(size_t)p_Var31);
              p_Var31 = (_Base_ptr)operator_new__(__n);
              p_Var16->_M_right = p_Var31;
              memcpy(p_Var31,sampleCountTableData,__n);
              p_Var31 = (pDVar3->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              bVar6 = true;
              p_Var27 = &p_Var2->_M_header;
              p_Var34 = &p_Var2->_M_header;
              if (p_Var31 == (_Base_ptr)0x0) {
LAB_00170aa9:
                p_Var17 = (_Rb_tree_node_base *)operator_new(0x38);
                __x = p_Var17 + 1;
                *(ulong *)(p_Var17 + 1) = CONCAT44(currentTile.dy,currentTile.dx);
                p_Var17[1]._M_parent = (_Base_ptr)CONCAT44(currentTile.ly,currentTile.lx);
                p_Var17[1]._M_left = (_Base_ptr)0x0;
                if (bVar6) {
                  pTVar28 = __y;
                  if ((pDVar3->tileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                    p_Var31 = (pDVar3->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_right;
                    bVar6 = std::less<Imf_2_5::(anonymous_namespace)::TileCoord>::operator()
                                      ((less<Imf_2_5::(anonymous_namespace)::TileCoord> *)
                                       (p_Var31 + 1),(TileCoord *)__x,__y);
                    pTVar28 = extraout_RDX;
                    if (bVar6) {
LAB_00170c68:
                      p_Var24 = (_Base_ptr)0x0;
                      goto LAB_00170c6a;
                    }
                  }
LAB_00170bd4:
                  p_Var31 = (pDVar3->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                  ;
                  p_Var34 = &p_Var2->_M_header;
                  if (p_Var31 == (_Base_ptr)0x0) {
LAB_00170c12:
                    if (p_Var34 !=
                        (pDVar3->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
                      auVar36 = std::_Rb_tree_decrement(p_Var34);
                      goto LAB_00170c26;
                    }
                  }
                  else {
                    do {
                      p_Var34 = p_Var31;
                      bVar6 = std::less<Imf_2_5::(anonymous_namespace)::TileCoord>::operator()
                                        ((less<Imf_2_5::(anonymous_namespace)::TileCoord> *)__x,
                                         (TileCoord *)(p_Var34 + 1),pTVar28);
                      auVar36._8_8_ = extraout_RDX_03;
                      auVar36._0_8_ = p_Var34;
                      p_Var31 = (&p_Var34->_M_left)[!bVar6];
                      pTVar28 = extraout_RDX_03;
                    } while ((&p_Var34->_M_left)[!bVar6] != (_Base_ptr)0x0);
                    if (bVar6) goto LAB_00170c12;
LAB_00170c26:
                    bVar6 = std::less<Imf_2_5::(anonymous_namespace)::TileCoord>::operator()
                                      ((less<Imf_2_5::(anonymous_namespace)::TileCoord> *)
                                       (auVar36._0_8_ + 1),(TileCoord *)__x,auVar36._8_8_);
                    pTVar28 = extraout_RDX_04;
                    p_Var24 = auVar36._0_8_;
                    if (!bVar6) goto LAB_00170cb0;
                  }
                  p_Var24 = (_Base_ptr)0x0;
                }
                else {
                  bVar6 = std::less<Imf_2_5::(anonymous_namespace)::TileCoord>::operator()
                                    ((less<Imf_2_5::(anonymous_namespace)::TileCoord> *)__x,
                                     (TileCoord *)(p_Var34 + 1),__y);
                  if (!bVar6) {
                    bVar6 = std::less<Imf_2_5::(anonymous_namespace)::TileCoord>::operator()
                                      ((less<Imf_2_5::(anonymous_namespace)::TileCoord> *)
                                       (p_Var34 + 1),(TileCoord *)__x,__y_00);
                    p_Var24 = p_Var34;
                    if (bVar6) {
                      p_Var31 = (pDVar3->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_right;
                      pTVar28 = extraout_RDX_01;
                      if (p_Var31 == p_Var34) goto LAB_00170c68;
                      auVar36 = std::_Rb_tree_increment(p_Var34);
                      p_Var24 = auVar36._0_8_;
                      bVar6 = std::less<Imf_2_5::(anonymous_namespace)::TileCoord>::operator()
                                        ((less<Imf_2_5::(anonymous_namespace)::TileCoord> *)__x,
                                         (TileCoord *)(p_Var24 + 1),auVar36._8_8_);
                      pTVar28 = extraout_RDX_02;
                      if (!bVar6) goto LAB_00170bd4;
                      p_Var31 = p_Var24;
                      if (p_Var34->_M_right == (_Base_ptr)0x0) goto LAB_00170bc8;
                      goto LAB_00170c6a;
                    }
LAB_00170cb0:
                    operator_delete(p_Var17,0x38);
                    goto LAB_00170cc5;
                  }
                  p_Var24 = (pDVar3->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  pTVar28 = __y_00;
                  p_Var31 = p_Var24;
                  if (p_Var24 == p_Var34) {
LAB_00170c6a:
                    p_Var34 = p_Var31;
                    if (p_Var31 == (_Base_ptr)0x0) goto LAB_00170cb0;
                  }
                  else {
                    auVar36 = std::_Rb_tree_decrement(p_Var34);
                    p_Var18 = auVar36._0_8_;
                    bVar6 = std::less<Imf_2_5::(anonymous_namespace)::TileCoord>::operator()
                                      ((less<Imf_2_5::(anonymous_namespace)::TileCoord> *)
                                       (p_Var18 + 1),(TileCoord *)__x,auVar36._8_8_);
                    pTVar28 = extraout_RDX_00;
                    if (!bVar6) goto LAB_00170bd4;
                    p_Var24 = p_Var34;
                    p_Var31 = p_Var34;
                    p_Var34 = p_Var18;
                    if (p_Var18->_M_right != (_Base_ptr)0x0) goto LAB_00170c6a;
LAB_00170bc8:
                    p_Var24 = (_Base_ptr)0x0;
                  }
                }
                bVar6 = true;
                if ((p_Var24 == (_Base_ptr)0x0) && (iVar14._M_node != p_Var34)) {
                  bVar6 = std::less<Imf_2_5::(anonymous_namespace)::TileCoord>::operator()
                                    ((less<Imf_2_5::(anonymous_namespace)::TileCoord> *)__x,
                                     (TileCoord *)(p_Var34 + 1),pTVar28);
                }
                std::_Rb_tree_insert_and_rebalance(bVar6,p_Var17,p_Var34,&p_Var2->_M_header);
                psVar1 = &(pDVar3->tileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
                *psVar1 = *psVar1 + 1;
                p_Var24 = p_Var17;
              }
              else {
                do {
                  iVar23 = *(int *)((long)&p_Var31[1]._M_parent + 4);
                  if (iVar23 < ly) {
LAB_00170a42:
                    lVar10 = 0x18;
                    p_Var24 = p_Var27;
                  }
                  else {
                    lVar10 = 0x10;
                    p_Var24 = p_Var31;
                    if (iVar23 == ly) {
                      if (*(int *)&p_Var31[1]._M_parent < lx) goto LAB_00170a42;
                      if (*(int *)&p_Var31[1]._M_parent == lx) {
                        if (*(int *)&p_Var31[1].field_0x4 < dy2) goto LAB_00170a42;
                        if (*(int *)&p_Var31[1].field_0x4 == dy2) {
                          if (iVar33 <= (int)p_Var31[1]._M_color) {
                            p_Var27 = p_Var31;
                          }
                          lVar10 = (ulong)((int)p_Var31[1]._M_color < iVar33) * 8 + 0x10;
                          p_Var24 = p_Var27;
                        }
                      }
                    }
                  }
                  p_Var31 = *(_Base_ptr *)
                             ((long)&((_Rb_tree_node_base *)&p_Var31->_M_color)->_M_color + lVar10);
                  p_Var27 = p_Var24;
                } while (p_Var31 != (_Base_ptr)0x0);
                p_Var34 = p_Var24;
                if (p_Var24 == iVar14._M_node) goto LAB_00170aa9;
                iVar23 = *(int *)((long)&p_Var24[1]._M_parent + 4);
                if ((ly < iVar23) ||
                   ((iVar23 == ly &&
                    ((lx < *(int *)&p_Var24[1]._M_parent ||
                     ((*(int *)&p_Var24[1]._M_parent == lx &&
                      ((dy2 < *(int *)&p_Var24[1].field_0x4 ||
                       ((*(int *)&p_Var24[1].field_0x4 == dy2 && (iVar33 < (int)p_Var24[1]._M_color)
                        ))))))))))) {
                  bVar6 = false;
                  goto LAB_00170aa9;
                }
              }
LAB_00170cc5:
              p_Var24[1]._M_left = p_Var16;
            }
          }
          IlmThread_2_5::Semaphore::post((Semaphore *)&pTVar5[1].dataSize);
          iVar23 = (int)local_3a0;
          if (iVar23 < (int)uVar25) {
            pTVar12 = (TileBufferTask *)operator_new(0x20);
            anon_unknown_8::TileBufferTask::TileBufferTask
                      (pTVar12,&taskGroup,this->_data,iVar23,iVar21,local_3c4,lx,ly);
            IlmThread_2_5::ThreadPool::addGlobalTask((Task *)pTVar12);
          }
          uVar29 = uVar29 + 1;
          iVar9 = iVar33 + 1;
          if (iVar7 <= iVar33) {
            iVar9 = dx2;
          }
          iVar22 = iVar8;
          if (iVar33 < iVar7) {
            iVar22 = 0;
          }
          dy2 = dy2 + iVar22;
          local_3a0 = (ulong)(iVar23 + 1);
          iVar23 = iVar21 + 1;
          bVar6 = iVar21 < iVar7;
          iVar33 = iVar8;
          iVar21 = dx2;
          if (bVar6) {
            iVar33 = 0;
            iVar21 = iVar23;
          }
          local_3c4 = local_3c4 + iVar33;
          iVar33 = iVar9;
        } while (uVar29 != uVar25);
      }
      IlmThread_2_5::TaskGroup::~TaskGroup(&taskGroup);
      ppTVar4 = (this->_data->tileBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = (long)(this->_data->tileBuffers).
                     super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4;
      if (lVar10 != 0) {
        lVar10 = lVar10 >> 3;
        lVar26 = 0;
        psVar30 = (string *)0x0;
        do {
          pTVar5 = ppTVar4[lVar26];
          text = (string *)((long)&(pTVar5->_sem)._semaphore + 0x10);
          if (psVar30 != (string *)0x0) {
            text = psVar30;
          }
          if ((pTVar5->_sem)._semaphore.__size[8] == '\0') {
            text = psVar30;
          }
          (pTVar5->_sem)._semaphore.__size[8] = '\0';
          lVar26 = lVar26 + 1;
          psVar30 = text;
        } while (lVar10 + (ulong)(lVar10 == 0) != lVar26);
        if (text != (string *)0x0) {
          this_02 = (IoExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::IoExc::IoExc(this_02,text);
          __cxa_throw(this_02,&Iex_2_5::IoExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
        }
      }
      pthread_mutex_unlock(__mutex);
      return;
    }
  }
  pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar20,local_3c0);
  __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

void
DeepTiledOutputFile::writeTiles (int dx1, int dx2, int dy1, int dy2,
                             int lx, int ly)
{
    try
    {
        Lock lock (*_data->_streamData);

        if (_data->slices.size() == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                               "as pixel data source.");

        if (!isValidTile (dx1, dy1, lx, ly) || !isValidTile (dx2, dy2, lx, ly))
            throw IEX_NAMESPACE::ArgExc ("Tile coordinates are invalid.");

        if (!isValidLevel (lx, ly))
            THROW (IEX_NAMESPACE::ArgExc,
                   "Level coordinate "
                   "(" << lx << ", " << ly << ") "
                   "is invalid.");
        //
        // Determine the first and last tile coordinates in both dimensions
        // based on the file's lineOrder
        //

        if (dx1 > dx2)
            swap (dx1, dx2);

        if (dy1 > dy2)
            swap (dy1, dy2);

        int dyStart = dy1;
        int dY      = 1;

        if (_data->lineOrder == DECREASING_Y)
        {
            dyStart = dy2;
            dY      = -1;
        }

        int numTiles = (dx2 - dx1 + 1) * (dy2 - dy1 + 1);
        int numTasks = min ((int)_data->tileBuffers.size(), numTiles);

        //
        // Create a task group for all tile buffer tasks.  When the
        // task group goes out of scope, the destructor waits until
        // all tasks are complete.
        //

        {
            TaskGroup taskGroup;

            //
            // Add in the initial compression tasks to the thread pool
            //

            int nextCompBuffer = 0;
            int dxComp         = dx1;
            int dyComp         = dyStart;

            while (nextCompBuffer < numTasks)
            {
                ThreadPool::addGlobalTask (new TileBufferTask (&taskGroup,
                                                               _data,
                                                               nextCompBuffer++,
                                                               dxComp, dyComp,
                                                               lx, ly));
                dxComp++;

                if (dxComp > dx2)
                {
                    dxComp = dx1;
                    dyComp += dY;
                }
            }

            //
            // Write the compressed buffers and add in more compression
            // tasks until done
            //

            int nextWriteBuffer = 0;
            int dxWrite         = dx1;
            int dyWrite         = dyStart;

            while (nextWriteBuffer < numTiles)
            {
                //
                // Wait until the nextWriteBuffer is ready to be written
                //

                TileBuffer* writeBuffer =
                                    _data->getTileBuffer (nextWriteBuffer);

                writeBuffer->wait();

                //
                // Write the tilebuffer
                //

                bufferedTileWrite ( _data, dxWrite, dyWrite, lx, ly,
                                   writeBuffer->dataPtr,
                                   writeBuffer->dataSize,
                                   writeBuffer->uncompressedSize,
                                   writeBuffer->sampleCountTablePtr,
                                   writeBuffer->sampleCountTableSize);

                //
                // Release the lock on nextWriteBuffer
                //

                writeBuffer->post();

                //
                // If there are no more tileBuffers to compress, then
                // only continue to write out remaining tileBuffers,
                // otherwise keep adding compression tasks.
                //

                if (nextCompBuffer < numTiles)
                {
                    //
                    // add nextCompBuffer as a compression Task
                    //

                    ThreadPool::addGlobalTask
                        (new TileBufferTask (&taskGroup,
                                             _data,
                                             nextCompBuffer,
                                             dxComp, dyComp,
                                             lx, ly));
                }

                nextWriteBuffer++;
                dxWrite++;

                if (dxWrite > dx2)
                {
                    dxWrite = dx1;
                    dyWrite += dY;
                }

                nextCompBuffer++;
                dxComp++;

                if (dxComp > dx2)
                {
                    dxComp = dx1;
                    dyComp += dY;
                }
            }

            //
            // finish all tasks
            //
        }

        //
        // Exeption handling:
        //
        // TileBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to TiledOutputFile::writeTiles().
        // TileBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the tile buffers.
        // Now we check if any tile buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple tile buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string *exception = 0;

        for (size_t i = 0; i < _data->tileBuffers.size(); ++i)
        {
            TileBuffer *tileBuffer = _data->tileBuffers[i];

            if (tileBuffer->hasException && !exception)
                exception = &tileBuffer->exception;

            tileBuffer->hasException = false;
        }

        if (exception)
            throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Failed to write pixel data to image "
                     "file \"" << fileName() << "\". " << e.what());
        throw;
    }
}